

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  SRes SVar2;
  byte bVar4;
  UInt16 *pUVar3;
  UInt32 UVar5;
  uint uVar6;
  
  SVar2 = 4;
  if (4 < propsSize) {
    uVar6 = 0x1000;
    if (0x1000 < *(uint *)(props + 1)) {
      uVar6 = *(uint *)(props + 1);
    }
    bVar1 = *props;
    SVar2 = 4;
    if (bVar1 < 0xe1) {
      bVar4 = (byte)((ushort)(bVar1 / 9) % 5);
      UVar5 = (0x300 << bVar4 + bVar1 % 9) + 0x736;
      if ((p->probs == (UInt16 *)0x0) || (UVar5 != p->numProbs)) {
        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->probs);
        p->probs = (UInt16 *)0x0;
        pUVar3 = (UInt16 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)(UVar5 * 2));
        p->probs = pUVar3;
        p->numProbs = UVar5;
        if (pUVar3 == (UInt16 *)0x0) {
          return 2;
        }
      }
      (p->prop).lc = (uint)(bVar1 % 9);
      (p->prop).lp = (uint)bVar4;
      (p->prop).pb = (uint)(bVar1 / 0x2d);
      (p->prop).dicSize = uVar6;
      SVar2 = 0;
    }
  }
  return SVar2;
}

Assistant:

static SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}